

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_pattern.cpp
# Opt level: O2

void __thiscall duckdb::FilenamePattern::SetFilenamePattern(FilenamePattern *this,string *pattern)

{
  ulong uVar1;
  idx_t iVar2;
  ulong uVar3;
  allocator local_d1;
  string local_d0;
  string uuid_format;
  string local_90;
  string id_format;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&id_format,"{i}",(allocator *)&uuid_format);
  ::std::__cxx11::string::string((string *)&uuid_format,"{uuid}",(allocator *)&local_90);
  ::std::__cxx11::string::_M_assign((string *)this);
  iVar2 = ::std::__cxx11::string::find((string *)this,(ulong)&id_format);
  this->pos = iVar2;
  this->uuid = false;
  if (iVar2 != 0xffffffffffffffff) {
    ::std::__cxx11::string::string((string *)&local_30,(string *)this);
    ::std::__cxx11::string::string((string *)&local_d0,anon_var_dwarf_4b71df5 + 9,&local_d1);
    StringUtil::Replace(&local_90,&local_30,&id_format,&local_d0);
    ::std::__cxx11::string::operator=((string *)this,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)&local_30);
    this->uuid = false;
  }
  iVar2 = ::std::__cxx11::string::find((string *)this,(ulong)&uuid_format);
  this->pos = iVar2;
  if (iVar2 == 0xffffffffffffffff) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_50,(string *)this);
    ::std::__cxx11::string::string((string *)&local_d0,anon_var_dwarf_4b71df5 + 9,&local_d1);
    StringUtil::Replace(&local_90,&local_50,&uuid_format,&local_d0);
    ::std::__cxx11::string::operator=((string *)this,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)&local_50);
    this->uuid = true;
    uVar3 = this->pos;
  }
  uVar1 = (this->base)._M_string_length;
  if (uVar1 < uVar3) {
    uVar3 = uVar1;
  }
  this->pos = uVar3;
  ::std::__cxx11::string::~string((string *)&uuid_format);
  ::std::__cxx11::string::~string((string *)&id_format);
  return;
}

Assistant:

void FilenamePattern::SetFilenamePattern(const string &pattern) {
	const string id_format {"{i}"};
	const string uuid_format {"{uuid}"};

	base = pattern;

	pos = base.find(id_format);
	uuid = false;
	if (pos != string::npos) {
		base = StringUtil::Replace(base, id_format, "");
		uuid = false;
	}

	pos = base.find(uuid_format);
	if (pos != string::npos) {
		base = StringUtil::Replace(base, uuid_format, "");
		uuid = true;
	}

	pos = std::min(pos, (idx_t)base.length());
}